

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O2

void addBeta2(NeuralNetwork *nn,OptimizerTypeCase optimizerType,double defaultValue,double minValue,
             double maxValue)

{
  NetworkUpdateParameters *this;
  Optimizer *this_00;
  AdamOptimizer *this_01;
  DoubleParameter *this_02;
  DoubleRange *pDVar1;
  
  this = CoreML::Specification::NeuralNetwork::mutable_updateparams(nn);
  this_00 = CoreML::Specification::NetworkUpdateParameters::mutable_optimizer(this);
  this_01 = CoreML::Specification::Optimizer::mutable_adamoptimizer(this_00);
  this_02 = CoreML::Specification::AdamOptimizer::mutable_beta2(this_01);
  this_02->defaultvalue_ = defaultValue;
  pDVar1 = CoreML::Specification::DoubleParameter::mutable_range(this_02);
  pDVar1->minvalue_ = minValue;
  pDVar1->maxvalue_ = maxValue;
  return;
}

Assistant:

void addBeta2(Specification::NeuralNetwork *nn, Specification::Optimizer::OptimizerTypeCase optimizerType, double defaultValue, double minValue, double maxValue) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto optimizer = updateParameters->mutable_optimizer();
    auto realOptimizer = (::CoreML::Specification::AdamOptimizer*)NULL;
    
    switch (optimizerType) {
        case Specification::Optimizer::kAdamOptimizer:
            realOptimizer = optimizer->mutable_adamoptimizer();
            break;
        default:
            break;
    }
    
    auto beta2 = realOptimizer->mutable_beta2();
    
    beta2->set_defaultvalue(defaultValue);
    
    auto doubleRange = beta2->mutable_range();
    doubleRange->set_minvalue(minValue);
    doubleRange->set_maxvalue(maxValue);
}